

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O2

void __thiscall
Am_Drawonable_Impl::Get_Polygon_Bounding_Box
          (Am_Drawonable_Impl *this,Am_Point_List *pl,Am_Style *ls,int *out_left,int *out_top,
          int *width,int *height)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong uVar16;
  int y;
  int x;
  short thick;
  double by;
  double bx;
  Am_Point_List local_e8;
  int th0;
  int firsty;
  int firstx;
  int th1;
  int local_c4;
  Am_Join_Style_Flag join;
  Am_Line_Cap_Style_Flag cap;
  int local_b8;
  int lastx;
  int nexty;
  int nextx;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  int *local_88;
  int *local_80;
  int *local_78;
  Am_Image_Array stipple;
  Am_Fill_Poly_Flag poly;
  Am_Fill_Solid_Flag fill;
  int dashl;
  Am_Line_Solid_Flag solid;
  double local_48;
  ulong uStack_40;
  char *dash;
  
  local_88 = out_left;
  local_80 = out_top;
  local_78 = width;
  Am_Image_Array::Am_Image_Array(&stipple);
  Am_Style::Get_Values(ls,&thick,&cap,&join,&solid,&dash,&dashl,&fill,&poly,&stipple);
  sVar7 = thick;
  if (((thick < 1) || (join != Am_JOIN_MITER)) ||
     (uVar2 = Am_Point_List::Length(pl), sVar7 = thick, uVar2 < 3)) {
    Am_Point_List::Get_Extents(pl,&x,&y,(int *)&bx,(int *)&by);
    iVar3 = (int)(sVar7 / 2);
    iVar10 = iVar3 * 2 + 1;
    *local_88 = x - iVar3;
    *local_80 = y - iVar3;
    *local_78 = (iVar10 - x) + bx._0_4_;
    *height = (iVar10 - y) + by._0_4_;
  }
  else {
    Am_Point_List::Am_Point_List(&local_e8,pl);
    iVar10 = (int)thick;
    Am_Point_List::Start(&local_e8);
    Am_Point_List::Get(&local_e8,&firstx,&firsty);
    Am_Point_List::End(&local_e8);
    Am_Point_List::Get(&local_e8,&lastx,&local_b8);
    if (local_b8 == firsty && lastx == firstx) {
      Am_Point_List::Prev(&local_e8);
      Am_Point_List::Get(&local_e8,&x,&y);
      Am_Point_List::Start(&local_e8);
      next_vertex(&local_e8,x,y,&x,&y,&bx,&by);
      local_48 = (double)CONCAT44(bx._4_4_,bx._0_4_);
      local_a8 = (double)CONCAT44(by._4_4_,by._0_4_);
      th0 = (int)(thick / 2);
      iVar11 = lastx;
      iVar9 = firsty;
      iVar6 = firsty;
      iVar12 = lastx;
    }
    else {
      th0 = (int)(thick / 2);
      iVar3 = th0;
      if (cap == Am_CAP_PROJECTING) {
        iVar3 = iVar10;
      }
      iVar12 = lastx - iVar3;
      if (firstx - iVar3 < lastx - iVar3) {
        iVar12 = firstx - iVar3;
      }
      iVar11 = lastx + iVar3;
      if (lastx + iVar3 < firstx + iVar3) {
        iVar11 = firstx + iVar3;
      }
      iVar6 = local_b8 - iVar3;
      if (firsty - iVar3 < local_b8 - iVar3) {
        iVar6 = firsty - iVar3;
      }
      iVar9 = iVar3 + local_b8;
      if (iVar3 + local_b8 < firsty + iVar3) {
        iVar9 = firsty + iVar3;
      }
      Am_Point_List::Start(&local_e8);
      Am_Point_List::Next(&local_e8);
      next_vertex(&local_e8,firstx,firsty,&x,&y,&bx,&by);
      local_48 = (double)CONCAT44(bx._4_4_,bx._0_4_);
      local_a8 = (double)CONCAT44(by._4_4_,by._0_4_);
    }
    uStack_90 = 0x8000000000000000;
    uStack_a0 = 0x8000000000000000;
    th1 = (iVar10 + 1) / 2;
    while( true ) {
      local_98 = -local_a8;
      local_a8 = -local_48;
      bVar1 = next_vertex(&local_e8,x,y,&nextx,&nexty,&bx,&by);
      if (!bVar1) break;
      local_48 = (double)CONCAT44(bx._4_4_,bx._0_4_);
      dVar14 = (double)CONCAT44(by._4_4_,by._0_4_);
      uStack_a0 = 0;
      if (ABS(local_a8 * local_48 + local_98 * dVar14) <= 0.981627183) {
        dVar13 = ((double)iVar10 * 0.5) / (local_a8 * dVar14 - local_48 * local_98);
        dVar15 = local_a8 + local_48;
        uStack_40 = 0;
        uStack_a0 = 0;
        local_a8 = dVar14;
        dVar14 = ceil(ABS(dVar15 * dVar13));
        local_c4 = iVar9;
        dVar13 = ceil(ABS((local_98 + local_a8) * dVar13));
        iVar5 = x - (int)dVar14;
        iVar3 = x + (int)dVar14;
        iVar8 = y - (int)dVar13;
        iVar4 = y + (int)dVar13;
        uVar16 = uStack_40;
        iVar9 = local_c4;
      }
      else {
        iVar5 = x - th0;
        iVar3 = x + th1;
        iVar8 = y - th0;
        iVar4 = y + th1;
        uVar16 = 0;
        local_a8 = dVar14;
      }
      if (iVar5 <= iVar12) {
        iVar12 = iVar5;
      }
      if (iVar11 <= iVar3) {
        iVar11 = iVar3;
      }
      if (iVar8 <= iVar6) {
        iVar6 = iVar8;
      }
      if (iVar9 <= iVar4) {
        iVar9 = iVar4;
      }
      x = nextx;
      y = nexty;
      uStack_90 = uStack_a0 ^ 0x8000000000000000;
      uStack_a0 = uVar16 ^ 0x8000000000000000;
    }
    Am_Point_List::~Am_Point_List(&local_e8);
    *local_88 = iVar12;
    *local_80 = iVar6;
    *local_78 = (iVar11 - iVar12) + 1;
    *height = (iVar9 - iVar6) + 1;
  }
  Am_Image_Array::~Am_Image_Array(&stipple);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_Polygon_Bounding_Box(const Am_Point_List &pl,
                                             const Am_Style &ls, int &out_left,
                                             int &out_top, int &width,
                                             int &height)
{
  short thick;
  Am_Line_Cap_Style_Flag cap;
  Am_Join_Style_Flag join;
  Am_Line_Solid_Flag solid;
  const char *dash;
  int dashl;
  Am_Fill_Solid_Flag fill;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array stipple;

  ls.Get_Values(thick, cap, join, solid, dash, dashl, fill, poly, stipple);

  if (thick > 0 && join == Am_JOIN_MITER && pl.Length() > 2) {
    int right, bottom, left, top;
    // slow: does several flops per point to compute the true vertex of
    // the mitered join
    compute_mitered_join_extents(pl, thick, cap, left, top, right, bottom);
    out_left = left;
    out_top = top;
    width = right - left + 1;
    height = bottom - top + 1;
  } else {
    const int th = thick / 2;

    // fast: just four comparisons per point, then adjust thickness
    int right, bottom, left, top;
    pl.Get_Extents(left, top, right, bottom);

    out_left = left - th;
    out_top = top - th;
    width = right - left + 1 + 2 * th;
    height = bottom - top + 1 + 2 * th;
  }
}